

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_ls.c
# Opt level: O1

int idaLs_AccessLMem(void *ida_mem,char *fname,IDAMem *IDA_mem,IDALsMem *idals_mem)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "Integrator memory is NULL.";
    iVar1 = -1;
    ida_mem = (IDAMem)0x0;
    error_code = -1;
    line = 0x70f;
  }
  else {
    *IDA_mem = (IDAMem)ida_mem;
    if (*(IDALsMem *)((long)ida_mem + 0x760) != (IDALsMem)0x0) {
      *idals_mem = *(IDALsMem *)((long)ida_mem + 0x760);
      return 0;
    }
    msgfmt = "Linear solver memory is NULL.";
    iVar1 = -2;
    error_code = -2;
    line = 0x716;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,line,fname,
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_ls.c"
                  ,msgfmt);
  return iVar1;
}

Assistant:

int idaLs_AccessLMem(void* ida_mem, const char* fname, IDAMem* IDA_mem,
                     IDALsMem* idals_mem)
{
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDALS_MEM_NULL, __LINE__, fname, __FILE__,
                    MSG_LS_IDAMEM_NULL);
    return (IDALS_MEM_NULL);
  }
  *IDA_mem = (IDAMem)ida_mem;
  if ((*IDA_mem)->ida_lmem == NULL)
  {
    IDAProcessError(*IDA_mem, IDALS_LMEM_NULL, __LINE__, fname, __FILE__,
                    MSG_LS_LMEM_NULL);
    return (IDALS_LMEM_NULL);
  }
  *idals_mem = (IDALsMem)(*IDA_mem)->ida_lmem;
  return (IDALS_SUCCESS);
}